

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeInteger(Parse *pParse,Expr *pExpr,int negFlag,int iMem)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  char *pcVar3;
  long in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  char *z;
  int c;
  int i;
  Vdbe *v;
  i64 value;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  u8 *in_stack_ffffffffffffffb8;
  Vdbe *v_00;
  int in_stack_ffffffffffffffcc;
  Vdbe *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI->pVdbe;
  if ((*(uint *)(in_RSI + 4) & 0x800) == 0) {
    v_00 = *(Vdbe **)(in_RSI + 8);
    iVar2 = sqlite3DecOrHexToI64((char *)CONCAT44(in_stack_ffffffffffffffcc,0xaaaaaaaa),(i64 *)v_00)
    ;
    if (((iVar2 == 3) && (in_EDX == 0)) || (iVar2 == 2)) {
      iVar2 = sqlite3_strnicmp((char *)v_00,"0x",2);
      if (iVar2 == 0) {
        pcVar3 = "";
        if (in_EDX != 0) {
          pcVar3 = "-";
        }
        sqlite3ErrorMsg(in_RDI,"hex literal too big: %s%#T",pcVar3,in_RSI);
      }
      else {
        codeReal(v_00,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                 in_stack_ffffffffffffffb0);
      }
    }
    else {
      if (in_EDX != 0) {
        if (iVar2 == 3) {
          in_stack_ffffffffffffffb8 = (u8 *)0x8000000000000000;
        }
        else {
          in_stack_ffffffffffffffb8 = (u8 *)0x5555555555555556;
        }
      }
      sqlite3VdbeAddOp4Dup8
                (p,in_stack_ffffffffffffffcc,iVar2,(int)((ulong)v_00 >> 0x20),(int)v_00,
                 in_stack_ffffffffffffffb8,(int)in_RSI);
    }
  }
  else {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void codeInteger(Parse *pParse, Expr *pExpr, int negFlag, int iMem){
  Vdbe *v = pParse->pVdbe;
  if( pExpr->flags & EP_IntValue ){
    int i = pExpr->u.iValue;
    assert( i>=0 );
    if( negFlag ) i = -i;
    sqlite3VdbeAddOp2(v, OP_Integer, i, iMem);
  }else{
    int c;
    i64 value;
    const char *z = pExpr->u.zToken;
    assert( z!=0 );
    c = sqlite3DecOrHexToI64(z, &value);
    if( (c==3 && !negFlag) || (c==2) || (negFlag && value==SMALLEST_INT64)){
#ifdef SQLITE_OMIT_FLOATING_POINT
      sqlite3ErrorMsg(pParse, "oversized integer: %s%#T", negFlag?"-":"",pExpr);
#else
#ifndef SQLITE_OMIT_HEX_INTEGER
      if( sqlite3_strnicmp(z,"0x",2)==0 ){
        sqlite3ErrorMsg(pParse, "hex literal too big: %s%#T",
                        negFlag?"-":"",pExpr);
      }else
#endif
      {
        codeReal(v, z, negFlag, iMem);
      }
#endif
    }else{
      if( negFlag ){ value = c==3 ? SMALLEST_INT64 : -value; }
      sqlite3VdbeAddOp4Dup8(v, OP_Int64, 0, iMem, 0, (u8*)&value, P4_INT64);
    }
  }
}